

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int ecp_select_comb(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *T,uchar t_len,
                   uchar i)

{
  int iVar1;
  undefined3 in_register_00000009;
  ulong uVar2;
  bool assign;
  
  uVar2 = 0;
  while( true ) {
    if (CONCAT31(in_register_00000009,t_len) == uVar2) {
      iVar1 = ecp_safe_invert_jac(grp,R,i >> 7);
      return iVar1;
    }
    assign = (i >> 1 & 0x3f) == uVar2;
    iVar1 = mbedtls_mpi_safe_cond_assign(&R->X,&T->X,assign);
    if (iVar1 != 0) break;
    iVar1 = mbedtls_mpi_safe_cond_assign(&R->Y,&T->Y,assign);
    uVar2 = uVar2 + 1;
    T = T + 1;
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

static int ecp_select_comb( const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                            const mbedtls_ecp_point T[], unsigned char t_len,
                            unsigned char i )
{
    int ret;
    unsigned char ii, j;

    /* Ignore the "sign" bit and scale down */
    ii =  ( i & 0x7Fu ) >> 1;

    /* Read the whole table to thwart cache-based timing attacks */
    for( j = 0; j < t_len; j++ )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_safe_cond_assign( &R->X, &T[j].X, j == ii ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_safe_cond_assign( &R->Y, &T[j].Y, j == ii ) );
    }

    /* Safely invert result if i is "negative" */
    MBEDTLS_MPI_CHK( ecp_safe_invert_jac( grp, R, i >> 7 ) );

cleanup:
    return( ret );
}